

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slot.hpp
# Opt level: O3

Slot<void_(int),_std::function<void_(int)>_> * __thiscall
sig::Slot<void(int),std::function<void(int)>>::
track<void(),sig::Optional_last_value<void>,int,std::less<int>,std::function<void()>,std::mutex>
          (Slot<void(int),std::function<void(int)>> *this,
          Signal<void_(),_sig::Optional_last_value<void>,_int,_std::less<int>,_std::function<void_()>,_std::mutex>
          *sig)

{
  _Atomic_word *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Atomic_word _Var2;
  weak_ptr<void> local_20;
  
  local_20.super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (sig->pimpl_).
       super___shared_ptr<sig::Signal_impl<void_(),_sig::Optional_last_value<void>,_int,_std::less<int>,_std::function<void_()>,_std::mutex>,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr;
  this_00 = (sig->pimpl_).
            super___shared_ptr<sig::Signal_impl<void_(),_sig::Optional_last_value<void>,_int,_std::less<int>,_std::function<void_()>,_std::mutex>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_20.super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    local_20.super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = this_00;
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_weak_count = this_00->_M_weak_count + 1;
        UNLOCK();
        goto LAB_0014abaf;
      }
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
    this_00->_M_weak_count = this_00->_M_weak_count + 1;
  }
LAB_0014abaf:
  std::vector<std::weak_ptr<void>,std::allocator<std::weak_ptr<void>>>::
  emplace_back<std::weak_ptr<void>>
            ((vector<std::weak_ptr<void>,std::allocator<std::weak_ptr<void>>> *)(this + 8),&local_20
            );
  if (local_20.super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_20.super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                _M_weak_count;
      _Var2 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      _Var2 = (local_20.super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_weak_count;
      (local_20.super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_weak_count
           = _Var2 + -1;
    }
    if (_Var2 == 1) {
      (*(local_20.super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base[3])();
    }
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return (Slot<void_(int),_std::function<void_(int)>_> *)this;
}

Assistant:

Slot& track(const Signal<T, U, V, W, X, Y>& sig) {
        tracked_ptrs_.push_back(sig.lock_impl_as_void());
        return *this;
    }